

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ON_SubDVertex * __thiscall
ON_SubDEdgePtr::RelativeVertex(ON_SubDEdgePtr *this,int relative_vertex_index)

{
  ON_SubDVertex *pOVar1;
  ulong uVar2;
  ulong uVar3;
  
  if ((uint)relative_vertex_index < 2) {
    pOVar1 = (ON_SubDVertex *)this->m_ptr;
    uVar2 = (ulong)pOVar1 & 0xfffffffffffffff8;
    if (uVar2 != 0) {
      uVar3 = (ulong)(1 - relative_vertex_index);
      if (((ulong)pOVar1 & 1) == 0) {
        uVar3 = (ulong)(uint)relative_vertex_index;
      }
      pOVar1 = *(ON_SubDVertex **)(uVar2 + 0x80 + uVar3 * 8);
    }
    if (uVar2 != 0) {
      return pOVar1;
    }
  }
  return (ON_SubDVertex *)0x0;
}

Assistant:

const class ON_SubDVertex* ON_SubDEdgePtr::RelativeVertex(
  int relative_vertex_index
  ) const
{
  for (;;)
  {
    if (relative_vertex_index < 0 || relative_vertex_index>1)
      break;
    const ON_SubDEdge* edge = ON_SUBD_EDGE_POINTER(m_ptr);
    if (nullptr == edge)
      break;
    if (0 != ON_SUBD_EDGE_DIRECTION(m_ptr))
      relative_vertex_index = 1 - relative_vertex_index;
    return edge->m_vertex[relative_vertex_index];
  }
  return nullptr;
}